

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataReliablePdu.cpp
# Opt level: O1

void __thiscall DIS::DataReliablePdu::DataReliablePdu(DataReliablePdu *this)

{
  SimulationManagementWithReliabilityFamilyPdu::SimulationManagementWithReliabilityFamilyPdu
            (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  (this->super_SimulationManagementWithReliabilityFamilyPdu).super_Pdu._vptr_Pdu =
       (_func_int **)&PTR__DataReliablePdu_0019f9c0;
  this->_requestID = 0;
  this->_requiredReliabilityService = '\0';
  this->_pad1 = 0;
  this->_pad2 = '\0';
  this->_numberOfFixedDatumRecords = 0;
  this->_numberOfVariableDatumRecords = 0;
  (this->_fixedDatumRecords).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_fixedDatumRecords).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_fixedDatumRecords).super__Vector_base<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_variableDatumRecords).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_variableDatumRecords).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_variableDatumRecords).
  super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Pdu::setPduType((Pdu *)this,'<');
  return;
}

Assistant:

DataReliablePdu::DataReliablePdu() : SimulationManagementWithReliabilityFamilyPdu(),
   _requestID(0), 
   _requiredReliabilityService(0), 
   _pad1(0), 
   _pad2(0), 
   _numberOfFixedDatumRecords(0), 
   _numberOfVariableDatumRecords(0)
{
    setPduType( 60 );
}